

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdvariablebyte.h
# Opt level: O1

void __thiscall
FastPForLib::MaskedVByte::encodeArray
          (MaskedVByte *this,uint32_t *in,size_t length,uint32_t *out,size_t *nvalue)

{
  uint uVar1;
  size_t sVar2;
  long lVar3;
  byte bVar4;
  ulong uVar5;
  uint32_t *__s;
  
  __s = out;
  if (length != 0) {
    sVar2 = 0;
    do {
      uVar1 = in[sVar2];
      bVar4 = (byte)uVar1;
      if (uVar1 < 0x80) {
        *(byte *)__s = bVar4;
        lVar3 = 1;
      }
      else if (uVar1 < 0x4000) {
        *(byte *)__s = bVar4 | 0x80;
        *(byte *)((long)__s + 1) = (byte)(uVar1 >> 7);
        lVar3 = 2;
      }
      else if (uVar1 < 0x200000) {
        *(byte *)__s = bVar4 | 0x80;
        *(byte *)((long)__s + 1) = (byte)(uVar1 >> 7) | 0x80;
        *(byte *)((long)__s + 2) = (byte)(uVar1 >> 0xe);
        lVar3 = 3;
      }
      else {
        *(byte *)__s = bVar4 | 0x80;
        *(byte *)((long)__s + 1) = (byte)(uVar1 >> 7) | 0x80;
        *(byte *)((long)__s + 2) = (byte)(uVar1 >> 0xe) | 0x80;
        bVar4 = (byte)(uVar1 >> 0x15);
        if (uVar1 < 0x10000000) {
          *(byte *)((long)__s + 3) = bVar4;
          lVar3 = 4;
        }
        else {
          *(byte *)((long)__s + 3) = bVar4 | 0x80;
          *(byte *)(__s + 1) = (byte)(uVar1 >> 0x1c);
          lVar3 = 5;
        }
      }
      __s = (uint32_t *)((long)__s + lVar3);
      sVar2 = sVar2 + 1;
    } while (length != sVar2);
  }
  if (((ulong)__s & 3) != 0) {
    uVar5 = (ulong)((uint)__s & 3);
    memset(__s,0xff,4 - uVar5);
    __s = (uint32_t *)((uVar5 ^ 3) + 1 + (long)__s);
  }
  *nvalue = (ulong)((long)__s - (long)out) >> 2;
  return;
}

Assistant:

void encodeArray(const uint32_t *in, const size_t length, uint32_t *out,
                   size_t &nvalue) {
    const uint8_t *const initbout = reinterpret_cast<uint8_t *>(out);
    uint8_t *bout = reinterpret_cast<uint8_t *>(out);
    for (size_t k = 0; k < length; ++k) {
      const uint32_t val(in[k]);
      /**
       * Code below could be shorter. Whether it could be faster
       * depends on your compiler and machine.
       */
      if (val < (1U << 7)) {
        *bout = val & 0x7F;
        ++bout;
      } else if (val < (1U << 14)) {
        *bout = static_cast<uint8_t>((val & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(val >> 7);
        ++bout;
      } else if (val < (1U << 21)) {
        *bout = static_cast<uint8_t>((val & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(((val >> 7) & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(val >> 14);
        ++bout;
      } else if (val < (1U << 28)) {
        *bout = static_cast<uint8_t>((val & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(((val >> 7) & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(((val >> 14) & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(val >> 21);
        ++bout;
      } else {
        *bout = static_cast<uint8_t>((val & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(((val >> 7) & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(((val >> 14) & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(((val >> 21) & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(val >> 28);
        ++bout;
      }
    }
    while (needPaddingTo32Bits(bout)) {
      *bout++ = 0xFFU;
    }
    const size_t storageinbytes = bout - initbout;
    nvalue = storageinbytes / 4;
  }